

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reduction.cpp
# Opt level: O3

int ncnn::
    reduction<ncnn::reduction_op_asum<float>,ncnn::reduction_op_add<float>,ncnn::post_process_identity<float>>
              (Mat *a,Mat *b,float v0,bool reduce_w,bool reduce_h,bool reduce_c,bool post_process,
              float coeff,int keepdims,Option *opt)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  long lVar6;
  int *piVar7;
  bool bVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  long lVar12;
  void *pvVar13;
  Mat *pMVar14;
  Mat *pMVar15;
  undefined7 in_register_00000011;
  void *pvVar16;
  Mat *pMVar17;
  Mat *pMVar18;
  Mat *pMVar19;
  byte bVar20;
  char cVar21;
  Mat *pMVar22;
  undefined7 in_register_00000081;
  bool bVar23;
  undefined7 in_register_00000089;
  ulong uVar24;
  void *pvVar25;
  ulong uVar26;
  Mat *pMVar27;
  uint uVar28;
  float fVar29;
  undefined4 in_stack_0000000c;
  Mat mins;
  int local_84;
  Mat local_78;
  
  lVar12 = CONCAT44(in_stack_0000000c,keepdims);
  sVar2 = a->elemsize;
  iVar1 = a->dims;
  pMVar22 = b;
  if ((int)CONCAT71(in_register_00000089,post_process) == 0) {
    if (iVar1 == 3) {
      uVar11 = a->w;
      lVar12 = (long)(int)uVar11;
      uVar10 = a->h;
      uVar24 = (ulong)uVar10;
      uVar9 = a->c;
      pMVar18 = (Mat *)(ulong)uVar9;
      uVar28 = uVar10 * uVar11;
      bVar23 = !reduce_w;
      bVar8 = !reduce_h;
      pMVar22 = (Mat *)(CONCAT71(in_register_00000081,reduce_c) & 0xffffffff ^ 1);
      cVar21 = (char)pMVar22;
      if ((bVar23 || bVar8) || cVar21 != '\0') {
        lVar6 = CONCAT44(in_stack_0000000c,keepdims);
        if ((!bVar23 && !bVar8) && !reduce_c) {
          pMVar22 = pMVar18;
          Mat::create(b,uVar9,sVar2,*(Allocator **)(lVar6 + 8));
          if (0 < (int)uVar9) {
            pvVar13 = a->data;
            sVar2 = a->elemsize;
            sVar3 = a->cstep;
            pvVar16 = b->data;
            pMVar22 = (Mat *)(ulong)uVar28;
            pMVar14 = (Mat *)0x0;
            do {
              fVar29 = 0.0;
              if (0 < (int)uVar28) {
                pMVar19 = (Mat *)0x0;
                do {
                  fVar29 = fVar29 + ABS(*(float *)((long)pvVar13 + (long)pMVar19 * 4));
                  pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                } while (pMVar22 != pMVar19);
              }
              *(float *)((long)pvVar16 + (long)pMVar14 * 4) = fVar29;
              pMVar14 = (Mat *)((long)&pMVar14->data + 1);
              pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
            } while (pMVar14 != pMVar18);
          }
          goto LAB_00201703;
        }
        pMVar14 = (Mat *)(ulong)uVar11;
        if ((!bVar23 && !reduce_h) && !reduce_c) {
          pMVar22 = (Mat *)(ulong)uVar10;
          Mat::create(b,uVar10,uVar9,sVar2,*(Allocator **)(lVar6 + 8));
          if (0 < (int)uVar9) {
            pvVar13 = a->data;
            sVar2 = a->elemsize;
            pvVar16 = b->data;
            pMVar22 = (Mat *)((long)b->w * b->elemsize);
            sVar3 = a->cstep;
            pMVar19 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                uVar26 = 0;
                pvVar25 = pvVar13;
                do {
                  fVar29 = 0.0;
                  if (0 < (int)uVar11) {
                    pMVar15 = (Mat *)0x0;
                    do {
                      fVar29 = fVar29 + ABS(*(float *)((long)pvVar25 + (long)pMVar15 * 4));
                      pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                    } while (pMVar14 != pMVar15);
                  }
                  *(float *)((long)pvVar16 + uVar26 * 4 + (long)pMVar22 * (long)pMVar19) = fVar29;
                  uVar26 = uVar26 + 1;
                  pvVar25 = (void *)((long)pvVar25 + lVar12 * 4);
                } while (uVar26 != uVar24);
              }
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
            } while (pMVar19 != pMVar18);
          }
          goto LAB_00201703;
        }
        if ((bVar23 || reduce_h) || cVar21 != '\0') {
          if ((bVar8 || reduce_w) || cVar21 != '\0') {
            if ((reduce_w || reduce_h) || cVar21 != '\0') {
              if ((!bVar8 && !reduce_w) && !reduce_c) {
                pMVar22 = pMVar14;
                Mat::create(b,uVar11,uVar9,sVar2,*(Allocator **)(lVar6 + 8));
                uVar28 = b->c * (int)b->cstep;
                if (0 < (int)uVar28) {
                  pMVar22 = (Mat *)0x0;
                  memset(b->data,0,(ulong)uVar28 << 2);
                }
                if (0 < (int)uVar9) {
                  pvVar13 = a->data;
                  sVar2 = a->elemsize;
                  pvVar16 = b->data;
                  sVar3 = a->cstep;
                  pMVar22 = (Mat *)((long)b->w * b->elemsize);
                  pMVar19 = (Mat *)0x0;
                  do {
                    if (0 < (int)uVar10) {
                      uVar9 = 0;
                      pvVar25 = pvVar13;
                      do {
                        if (0 < (int)uVar11) {
                          pMVar15 = (Mat *)0x0;
                          do {
                            *(float *)((long)pvVar16 + (long)pMVar15 * 4) =
                                 ABS(*(float *)((long)pvVar25 + (long)pMVar15 * 4)) +
                                 *(float *)((long)pvVar16 + (long)pMVar15 * 4);
                            pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                          } while (pMVar14 != pMVar15);
                        }
                        uVar9 = uVar9 + 1;
                        pvVar25 = (void *)((long)pvVar25 + (long)(int)uVar11 * 4);
                      } while (uVar9 != uVar10);
                    }
                    pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                    pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
                    pvVar16 = (void *)((long)&pMVar22->data + (long)pvVar16);
                  } while (pMVar19 != pMVar18);
                }
              }
            }
            else {
              Mat::create(b,uVar11,uVar10,sVar2,*(Allocator **)(lVar6 + 8));
              uVar11 = b->c * (int)b->cstep;
              pMVar22 = pMVar14;
              if (0 < (int)uVar11) {
                pMVar22 = (Mat *)0x0;
                memset(b->data,0,(ulong)uVar11 << 2);
              }
              if (0 < (int)uVar9) {
                pvVar13 = a->data;
                sVar2 = a->elemsize;
                sVar3 = a->cstep;
                pvVar16 = b->data;
                pMVar22 = (Mat *)(ulong)uVar28;
                pMVar14 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar28) {
                    pMVar19 = (Mat *)0x0;
                    do {
                      *(float *)((long)pvVar16 + (long)pMVar19 * 4) =
                           ABS(*(float *)((long)pvVar13 + (long)pMVar19 * 4)) +
                           *(float *)((long)pvVar16 + (long)pMVar19 * 4);
                      pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                    } while (pMVar22 != pMVar19);
                  }
                  pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                  pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
                } while (pMVar14 != pMVar18);
              }
            }
            goto LAB_00201703;
          }
          Mat::create(b,uVar11,sVar2,*(Allocator **)(lVar6 + 8));
          local_78.cstep = 0;
          local_78.data = (Mat *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.d = 0;
          local_78.c = 0;
          pMVar22 = (Mat *)(ulong)uVar11;
          Mat::create(&local_78,uVar11,1,uVar9,sVar2,
                      *(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 0x10));
          sVar2 = local_78.cstep;
          pMVar19 = (Mat *)local_78.data;
          local_84 = -100;
          if (((Mat *)local_78.data != (Mat *)0x0) && (local_78.cstep * (long)local_78.c != 0)) {
            uVar28 = (int)local_78.cstep * local_78.c;
            if (0 < (int)uVar28) {
              pMVar22 = (Mat *)0x0;
              memset(local_78.data,0,(ulong)uVar28 << 2);
            }
            if (0 < (int)uVar9) {
              pvVar13 = a->data;
              sVar3 = a->elemsize;
              sVar4 = a->cstep;
              pMVar22 = (Mat *)(CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                               sVar2);
              pMVar17 = (Mat *)0x0;
              pMVar15 = pMVar19;
              do {
                if (0 < (int)uVar10) {
                  uVar28 = 0;
                  pvVar16 = pvVar13;
                  do {
                    if (0 < (int)uVar11) {
                      pMVar27 = (Mat *)0x0;
                      do {
                        *(float *)((long)&pMVar15->data + (long)pMVar27 * 4) =
                             ABS(*(float *)((long)pvVar16 + (long)pMVar27 * 4)) +
                             *(float *)((long)&pMVar15->data + (long)pMVar27 * 4);
                        pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                      } while (pMVar14 != pMVar27);
                    }
                    uVar28 = uVar28 + 1;
                    pvVar16 = (void *)((long)pvVar16 + lVar12 * 4);
                  } while (uVar28 != uVar10);
                }
                pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
                pMVar15 = (Mat *)((long)&pMVar22->data + (long)&pMVar15->data);
              } while (pMVar17 != pMVar18);
            }
            uVar10 = b->c * (int)b->cstep;
            if (0 < (int)uVar10) {
              pMVar22 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar10 << 2);
            }
            if (0 < (int)uVar9) {
              pvVar13 = b->data;
              pMVar15 = (Mat *)0x0;
              do {
                if (0 < (int)uVar11) {
                  pMVar17 = (Mat *)0x0;
                  do {
                    *(float *)((long)pvVar13 + (long)pMVar17 * 4) =
                         *(float *)((long)&pMVar19->data + (long)pMVar17 * 4) +
                         *(float *)((long)pvVar13 + (long)pMVar17 * 4);
                    pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                  } while (pMVar14 != pMVar17);
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pMVar19 = (Mat *)((long)&pMVar19->data +
                                 sVar2 * CONCAT44(local_78.elemsize._4_4_,
                                                  (undefined4)local_78.elemsize));
              } while (pMVar15 != pMVar18);
            }
            goto LAB_002016de;
          }
        }
        else {
          Mat::create(b,uVar10,sVar2,*(Allocator **)(lVar6 + 8));
          local_78.cstep = 0;
          local_78.data = (Mat *)0x0;
          local_78.refcount._0_4_ = 0;
          local_78.refcount._4_4_ = 0;
          local_78.elemsize._0_4_ = 0;
          local_78.elemsize._4_4_ = 0;
          local_78.elempack = 0;
          local_78.allocator = (Allocator *)0x0;
          local_78.dims = 0;
          local_78.w = 0;
          local_78.h = 0;
          local_78.d = 0;
          local_78.c = 0;
          pMVar22 = (Mat *)0x1;
          Mat::create(&local_78,1,uVar10,uVar9,sVar2,
                      *(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 0x10));
          sVar2 = local_78.cstep;
          pMVar19 = (Mat *)local_78.data;
          local_84 = -100;
          if (((Mat *)local_78.data != (Mat *)0x0) && (local_78.cstep * (long)local_78.c != 0)) {
            uVar28 = (int)local_78.cstep * local_78.c;
            if (0 < (int)uVar28) {
              pMVar22 = (Mat *)0x0;
              memset(local_78.data,0,(ulong)uVar28 << 2);
            }
            if (0 < (int)uVar9) {
              pvVar13 = a->data;
              sVar3 = a->elemsize;
              sVar4 = a->cstep;
              pMVar22 = (Mat *)(lVar12 * 4);
              pMVar15 = (Mat *)0x0;
              do {
                if (0 < (int)uVar10) {
                  uVar26 = 0;
                  pvVar16 = pvVar13;
                  do {
                    fVar29 = 0.0;
                    if (0 < (int)uVar11) {
                      pMVar17 = (Mat *)0x0;
                      do {
                        fVar29 = fVar29 + ABS(*(float *)((long)pvVar16 + (long)pMVar17 * 4));
                        pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                      } while (pMVar14 != pMVar17);
                    }
                    *(float *)((long)&pMVar19->data +
                              uVar26 * 4 +
                              CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                              sVar2 * (long)pMVar15) = fVar29;
                    uVar26 = uVar26 + 1;
                    pvVar16 = (void *)((long)&pMVar22->data + (long)pvVar16);
                  } while (uVar26 != uVar24);
                }
                pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
              } while (pMVar15 != pMVar18);
            }
            uVar11 = b->c * (int)b->cstep;
            if (0 < (int)uVar11) {
              pMVar22 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar11 << 2);
            }
            if (0 < (int)uVar9) {
              pvVar13 = b->data;
              pMVar14 = (Mat *)0x0;
              do {
                if (0 < (int)uVar10) {
                  uVar26 = 0;
                  do {
                    *(float *)((long)pvVar13 + uVar26 * 4) =
                         *(float *)((long)&pMVar19->data + uVar26 * 4) +
                         *(float *)((long)pvVar13 + uVar26 * 4);
                    uVar26 = uVar26 + 1;
                  } while (uVar24 != uVar26);
                }
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                pMVar19 = (Mat *)((long)&pMVar19->data +
                                 sVar2 * CONCAT44(local_78.elemsize._4_4_,
                                                  (undefined4)local_78.elemsize));
              } while (pMVar14 != pMVar18);
            }
            goto LAB_002016de;
          }
        }
        goto LAB_002016e6;
      }
      Mat::create(b,1,sVar2,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
      local_78.cstep = 0;
      local_78.data = (Mat *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      pMVar22 = pMVar18;
      Mat::create(&local_78,uVar9,sVar2,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 0x10)
                 );
      local_84 = -100;
      if (((Mat *)local_78.data != (Mat *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
        if ((int)uVar9 < 1) {
          fVar29 = 0.0;
        }
        else {
          sVar2 = a->elemsize;
          sVar3 = a->cstep;
          pvVar13 = a->data;
          pMVar22 = (Mat *)(ulong)uVar28;
          pMVar14 = (Mat *)0x0;
          do {
            fVar29 = 0.0;
            if (0 < (int)uVar28) {
              pMVar19 = (Mat *)0x0;
              do {
                fVar29 = fVar29 + ABS(*(float *)((long)pvVar13 + (long)pMVar19 * 4));
                pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              } while (pMVar22 != pMVar19);
            }
            *(float *)((long)(void **)local_78.data + (long)pMVar14 * 4) = fVar29;
            pMVar14 = (Mat *)((long)&pMVar14->data + 1);
            pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
          } while (pMVar14 != pMVar18);
          fVar29 = 0.0;
          pMVar14 = (Mat *)0x0;
          do {
            fVar29 = fVar29 + *(float *)((long)(void **)local_78.data + (long)pMVar14 * 4);
            pMVar14 = (Mat *)((long)&pMVar14->data + 1);
          } while (pMVar18 != pMVar14);
        }
        *(float *)b->data = fVar29;
        local_84 = 0;
      }
      piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_78.allocator == (Allocator *)0x0) goto LAB_00201217;
          pMVar22 = (Mat *)local_78.data;
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    else {
      if (iVar1 != 2) {
        if (iVar1 != 1) goto LAB_00201703;
        iVar1 = a->w;
        pMVar22 = (Mat *)0x1;
        Mat::create(b,1,sVar2,*(Allocator **)(lVar12 + 8));
        if ((long)iVar1 < 1) goto LAB_0020081d;
        fVar29 = 0.0;
        lVar12 = 0;
        do {
          fVar29 = fVar29 + ABS(*(float *)((long)a->data + lVar12 * 4));
          lVar12 = lVar12 + 1;
        } while (iVar1 != lVar12);
        goto LAB_00200826;
      }
      uVar11 = a->w;
      pMVar14 = (Mat *)(ulong)uVar11;
      uVar10 = a->h;
      pMVar18 = (Mat *)(ulong)uVar10;
      uVar24 = CONCAT71(in_register_00000011,reduce_w) & 0xffffffff;
      bVar20 = (byte)uVar24 ^ 1;
      if (bVar20 != 0 || !reduce_h) {
        bVar20 = bVar20 | reduce_h;
        pMVar22 = (Mat *)CONCAT71((int7)(uVar24 >> 8),bVar20);
        if (bVar20 == 0) {
          pMVar22 = pMVar18;
          Mat::create(b,uVar10,sVar2,*(Allocator **)(lVar12 + 8));
          if (0 < (int)uVar10) {
            iVar1 = a->w;
            sVar2 = a->elemsize;
            pvVar13 = a->data;
            pvVar16 = b->data;
            pMVar22 = (Mat *)0x0;
            do {
              fVar29 = 0.0;
              if (0 < (int)uVar11) {
                pMVar19 = (Mat *)0x0;
                do {
                  fVar29 = fVar29 + ABS(*(float *)((long)pvVar13 + (long)pMVar19 * 4));
                  pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                } while (pMVar14 != pMVar19);
              }
              *(float *)((long)pvVar16 + (long)pMVar22 * 4) = fVar29;
              pMVar22 = (Mat *)((long)&pMVar22->data + 1);
              pvVar13 = (void *)((long)pvVar13 + (long)iVar1 * sVar2);
            } while (pMVar22 != pMVar18);
          }
        }
        else if (reduce_h && !reduce_w) {
          pMVar22 = pMVar14;
          Mat::create(b,uVar11,sVar2,*(Allocator **)(lVar12 + 8));
          uVar9 = b->c * (int)b->cstep;
          if (0 < (int)uVar9) {
            pMVar22 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar9 << 2);
          }
          if (0 < (int)uVar10) {
            iVar1 = a->w;
            sVar2 = a->elemsize;
            pvVar13 = a->data;
            pvVar16 = b->data;
            pMVar22 = (Mat *)0x0;
            do {
              if (0 < (int)uVar11) {
                pMVar19 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar16 + (long)pMVar19 * 4) =
                       ABS(*(float *)((long)pvVar13 + (long)pMVar19 * 4)) +
                       *(float *)((long)pvVar16 + (long)pMVar19 * 4);
                  pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                } while (pMVar14 != pMVar19);
              }
              pMVar22 = (Mat *)((long)&pMVar22->data + 1);
              pvVar13 = (void *)((long)pvVar13 + (long)iVar1 * sVar2);
            } while (pMVar22 != pMVar18);
          }
        }
        goto LAB_00201703;
      }
      Mat::create(b,1,sVar2,*(Allocator **)(lVar12 + 8));
      local_78.cstep = 0;
      local_78.data = (Mat *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      pMVar22 = pMVar18;
      Mat::create(&local_78,uVar10,sVar2,*(Allocator **)(lVar12 + 0x10));
      local_84 = -100;
      if (((Mat *)local_78.data != (Mat *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
        if ((int)uVar10 < 1) {
          fVar29 = 0.0;
        }
        else {
          pvVar13 = a->data;
          iVar1 = a->w;
          sVar2 = a->elemsize;
          pMVar22 = (Mat *)0x0;
          do {
            fVar29 = 0.0;
            if (0 < (int)uVar11) {
              pMVar19 = (Mat *)0x0;
              do {
                fVar29 = fVar29 + ABS(*(float *)((long)pvVar13 + (long)pMVar19 * 4));
                pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              } while (pMVar14 != pMVar19);
            }
            *(float *)((long)(void **)local_78.data + (long)pMVar22 * 4) = fVar29;
            pMVar22 = (Mat *)((long)&pMVar22->data + 1);
            pvVar13 = (void *)((long)pvVar13 + (long)iVar1 * sVar2);
          } while (pMVar22 != pMVar18);
          fVar29 = 0.0;
          pMVar14 = (Mat *)0x0;
          do {
            fVar29 = fVar29 + *(float *)((long)(void **)local_78.data + (long)pMVar14 * 4);
            pMVar14 = (Mat *)((long)&pMVar14->data + 1);
          } while (pMVar18 != pMVar14);
        }
        *(float *)b->data = fVar29;
        local_84 = 0;
      }
      piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_78.allocator == (Allocator *)0x0) goto LAB_00201217;
          pMVar22 = (Mat *)local_78.data;
          (*(local_78.allocator)->_vptr_Allocator[3])();
        }
      }
    }
  }
  else if (iVar1 == 3) {
    uVar11 = a->w;
    lVar12 = (long)(int)uVar11;
    uVar10 = a->h;
    uVar24 = (ulong)uVar10;
    uVar9 = a->c;
    pMVar18 = (Mat *)(ulong)uVar9;
    uVar28 = uVar10 * uVar11;
    bVar8 = !reduce_h;
    pMVar22 = (Mat *)(CONCAT71(in_register_00000081,reduce_c) & 0xffffffff ^ 1);
    cVar21 = (char)pMVar22;
    if ((reduce_w && !bVar8) && cVar21 == '\0') {
      Mat::create(b,1,1,1,sVar2,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 8));
      local_78.cstep = 0;
      local_78.data = (Mat *)0x0;
      local_78.refcount._0_4_ = 0;
      local_78.refcount._4_4_ = 0;
      local_78.elemsize._0_4_ = 0;
      local_78.elemsize._4_4_ = 0;
      local_78.elempack = 0;
      local_78.allocator = (Allocator *)0x0;
      local_78.dims = 0;
      local_78.w = 0;
      local_78.h = 0;
      local_78.d = 0;
      local_78.c = 0;
      pMVar22 = pMVar18;
      Mat::create(&local_78,uVar9,sVar2,*(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 0x10)
                 );
      local_84 = -100;
      if (((Mat *)local_78.data != (Mat *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
        if ((int)uVar9 < 1) {
          fVar29 = 0.0;
        }
        else {
          sVar2 = a->elemsize;
          sVar3 = a->cstep;
          pvVar13 = a->data;
          pMVar22 = (Mat *)(ulong)uVar28;
          pMVar14 = (Mat *)0x0;
          do {
            fVar29 = 0.0;
            if (0 < (int)uVar28) {
              pMVar19 = (Mat *)0x0;
              do {
                fVar29 = fVar29 + ABS(*(float *)((long)pvVar13 + (long)pMVar19 * 4));
                pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              } while (pMVar22 != pMVar19);
            }
            *(float *)((long)(void **)local_78.data + (long)pMVar14 * 4) = fVar29;
            pMVar14 = (Mat *)((long)&pMVar14->data + 1);
            pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
          } while (pMVar14 != pMVar18);
          fVar29 = 0.0;
          pMVar14 = (Mat *)0x0;
          do {
            fVar29 = fVar29 + *(float *)((long)(void **)local_78.data + (long)pMVar14 * 4);
            pMVar14 = (Mat *)((long)&pMVar14->data + 1);
          } while (pMVar18 != pMVar14);
        }
        *(float *)b->data = fVar29;
        local_84 = 0;
      }
      piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
      if (piVar7 != (int *)0x0) {
        LOCK();
        *piVar7 = *piVar7 + -1;
        UNLOCK();
        if (*piVar7 == 0) {
          if (local_78.allocator == (Allocator *)0x0) {
LAB_00201217:
            pMVar22 = (Mat *)local_78.data;
            if ((Mat *)local_78.data != (Mat *)0x0) {
              free(local_78.data);
            }
          }
          else {
            pMVar22 = (Mat *)local_78.data;
            (*(local_78.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    else {
      lVar6 = CONCAT44(in_stack_0000000c,keepdims);
      if ((reduce_w && !bVar8) && !reduce_c) {
        pMVar22 = (Mat *)0x1;
        Mat::create(b,1,1,uVar9,sVar2,*(Allocator **)(lVar6 + 8));
        if (0 < (int)uVar9) {
          pvVar13 = a->data;
          sVar2 = a->elemsize;
          pvVar16 = b->data;
          pMVar22 = (Mat *)(b->elemsize * b->cstep);
          sVar3 = a->cstep;
          pMVar14 = (Mat *)0x0;
          do {
            fVar29 = 0.0;
            if (0 < (int)uVar28) {
              uVar24 = 0;
              do {
                fVar29 = fVar29 + ABS(*(float *)((long)pvVar13 + uVar24 * 4));
                uVar24 = uVar24 + 1;
              } while (uVar28 != uVar24);
            }
            *(float *)((long)pvVar16 + (long)pMVar22 * (long)pMVar14) = fVar29;
            pMVar14 = (Mat *)((long)&pMVar14->data + 1);
            pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
          } while (pMVar14 != pMVar18);
        }
        goto LAB_00201703;
      }
      pMVar14 = (Mat *)(ulong)uVar11;
      if ((reduce_w && !reduce_h) && !reduce_c) {
        pMVar22 = (Mat *)0x1;
        Mat::create(b,1,uVar10,uVar9,sVar2,*(Allocator **)(lVar6 + 8));
        if (0 < (int)uVar9) {
          pvVar13 = a->data;
          sVar2 = a->elemsize;
          pvVar16 = b->data;
          pMVar22 = (Mat *)(b->elemsize * b->cstep);
          sVar3 = a->cstep;
          pMVar19 = (Mat *)0x0;
          do {
            if (0 < (int)uVar10) {
              uVar26 = 0;
              pvVar25 = pvVar13;
              do {
                fVar29 = 0.0;
                if (0 < (int)uVar11) {
                  pMVar15 = (Mat *)0x0;
                  do {
                    fVar29 = fVar29 + ABS(*(float *)((long)pvVar25 + (long)pMVar15 * 4));
                    pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                  } while (pMVar14 != pMVar15);
                }
                *(float *)((long)pvVar16 + uVar26 * 4 + (long)pMVar22 * (long)pMVar19) = fVar29;
                uVar26 = uVar26 + 1;
                pvVar25 = (void *)((long)pvVar25 + lVar12 * 4);
              } while (uVar26 != uVar24);
            }
            pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
          } while (pMVar19 != pMVar18);
        }
        goto LAB_00201703;
      }
      if ((reduce_w && !reduce_h) && cVar21 == '\0') {
        Mat::create(b,1,uVar10,1,sVar2,*(Allocator **)(lVar6 + 8));
        local_78.cstep = 0;
        local_78.data = (Mat *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        pMVar22 = (Mat *)0x1;
        Mat::create(&local_78,1,uVar10,uVar9,sVar2,
                    *(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 0x10));
        sVar2 = local_78.cstep;
        pMVar19 = (Mat *)local_78.data;
        local_84 = -100;
        if (((Mat *)local_78.data != (Mat *)0x0) && (local_78.cstep * (long)local_78.c != 0)) {
          uVar28 = (int)local_78.cstep * local_78.c;
          if (0 < (int)uVar28) {
            pMVar22 = (Mat *)0x0;
            memset(local_78.data,0,(ulong)uVar28 << 2);
          }
          if (0 < (int)uVar9) {
            pvVar13 = a->data;
            sVar3 = a->elemsize;
            sVar4 = a->cstep;
            pMVar22 = (Mat *)(lVar12 * 4);
            pMVar15 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                uVar26 = 0;
                pvVar16 = pvVar13;
                do {
                  fVar29 = 0.0;
                  if (0 < (int)uVar11) {
                    pMVar17 = (Mat *)0x0;
                    do {
                      fVar29 = fVar29 + ABS(*(float *)((long)pvVar16 + (long)pMVar17 * 4));
                      pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                    } while (pMVar14 != pMVar17);
                  }
                  *(float *)((long)&pMVar19->data +
                            uVar26 * 4 +
                            CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) * sVar2
                            * (long)pMVar15) = fVar29;
                  uVar26 = uVar26 + 1;
                  pvVar16 = (void *)((long)&pMVar22->data + (long)pvVar16);
                } while (uVar26 != uVar24);
              }
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
            } while (pMVar15 != pMVar18);
          }
          uVar11 = b->c * (int)b->cstep;
          if (0 < (int)uVar11) {
            pMVar22 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar11 << 2);
          }
          if (0 < (int)uVar9) {
            pvVar13 = b->data;
            pMVar14 = (Mat *)0x0;
            do {
              if (0 < (int)uVar10) {
                uVar26 = 0;
                do {
                  *(float *)((long)pvVar13 + uVar26 * 4) =
                       *(float *)((long)&pMVar19->data + uVar26 * 4) +
                       *(float *)((long)pvVar13 + uVar26 * 4);
                  uVar26 = uVar26 + 1;
                } while (uVar24 != uVar26);
              }
              pMVar14 = (Mat *)((long)&pMVar14->data + 1);
              pMVar19 = (Mat *)((long)&pMVar19->data +
                               sVar2 * CONCAT44(local_78.elemsize._4_4_,
                                                (undefined4)local_78.elemsize));
            } while (pMVar14 != pMVar18);
          }
LAB_002016de:
          local_84 = 0;
        }
      }
      else {
        if ((bVar8 || reduce_w) || cVar21 != '\0') {
          if ((reduce_w || reduce_h) || cVar21 != '\0') {
            if ((!bVar8 && !reduce_w) && !reduce_c) {
              pMVar22 = pMVar14;
              Mat::create(b,uVar11,1,uVar9,sVar2,*(Allocator **)(lVar6 + 8));
              sVar2 = b->cstep;
              uVar28 = b->c * (int)sVar2;
              if (0 < (int)uVar28) {
                pMVar22 = (Mat *)0x0;
                memset(b->data,0,(ulong)uVar28 << 2);
              }
              if (0 < (int)uVar9) {
                pvVar13 = a->data;
                sVar3 = a->elemsize;
                pvVar16 = b->data;
                sVar4 = a->cstep;
                pMVar22 = (Mat *)((long)(int)uVar11 * 4);
                sVar5 = b->elemsize;
                pMVar19 = (Mat *)0x0;
                do {
                  if (0 < (int)uVar10) {
                    uVar9 = 0;
                    pvVar25 = pvVar13;
                    do {
                      if (0 < (int)uVar11) {
                        pMVar15 = (Mat *)0x0;
                        do {
                          *(float *)((long)pvVar16 + (long)pMVar15 * 4) =
                               ABS(*(float *)((long)pvVar25 + (long)pMVar15 * 4)) +
                               *(float *)((long)pvVar16 + (long)pMVar15 * 4);
                          pMVar15 = (Mat *)((long)&pMVar15->data + 1);
                        } while (pMVar14 != pMVar15);
                      }
                      uVar9 = uVar9 + 1;
                      pvVar25 = (void *)((long)&pMVar22->data + (long)pvVar25);
                    } while (uVar9 != uVar10);
                  }
                  pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                  pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
                  pvVar16 = (void *)((long)pvVar16 + sVar2 * sVar5);
                } while (pMVar19 != pMVar18);
              }
            }
          }
          else {
            Mat::create(b,uVar11,uVar10,1,sVar2,*(Allocator **)(lVar6 + 8));
            uVar11 = b->c * (int)b->cstep;
            if (0 < (int)uVar11) {
              pMVar14 = (Mat *)0x0;
              memset(b->data,0,(ulong)uVar11 << 2);
            }
            pMVar22 = pMVar14;
            if (0 < (int)uVar9) {
              pvVar13 = a->data;
              sVar2 = a->elemsize;
              sVar3 = a->cstep;
              pvVar16 = b->data;
              pMVar22 = (Mat *)(ulong)uVar28;
              pMVar14 = (Mat *)0x0;
              do {
                if (0 < (int)uVar28) {
                  pMVar19 = (Mat *)0x0;
                  do {
                    *(float *)((long)pvVar16 + (long)pMVar19 * 4) =
                         ABS(*(float *)((long)pvVar13 + (long)pMVar19 * 4)) +
                         *(float *)((long)pvVar16 + (long)pMVar19 * 4);
                    pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                  } while (pMVar22 != pMVar19);
                }
                pMVar14 = (Mat *)((long)&pMVar14->data + 1);
                pvVar13 = (void *)((long)pvVar13 + sVar2 * sVar3);
              } while (pMVar14 != pMVar18);
            }
          }
          goto LAB_00201703;
        }
        Mat::create(b,uVar11,1,1,sVar2,*(Allocator **)(lVar6 + 8));
        local_78.cstep = 0;
        local_78.data = (Mat *)0x0;
        local_78.refcount._0_4_ = 0;
        local_78.refcount._4_4_ = 0;
        local_78.elemsize._0_4_ = 0;
        local_78.elemsize._4_4_ = 0;
        local_78.elempack = 0;
        local_78.allocator = (Allocator *)0x0;
        local_78.dims = 0;
        local_78.w = 0;
        local_78.h = 0;
        local_78.d = 0;
        local_78.c = 0;
        pMVar22 = (Mat *)(ulong)uVar11;
        Mat::create(&local_78,uVar11,1,uVar9,sVar2,
                    *(Allocator **)(CONCAT44(in_stack_0000000c,keepdims) + 0x10));
        sVar2 = local_78.cstep;
        pMVar19 = (Mat *)local_78.data;
        local_84 = -100;
        if (((Mat *)local_78.data != (Mat *)0x0) && (local_78.cstep * (long)local_78.c != 0)) {
          uVar28 = (int)local_78.cstep * local_78.c;
          if (0 < (int)uVar28) {
            pMVar22 = (Mat *)0x0;
            memset(local_78.data,0,(ulong)uVar28 << 2);
          }
          if (0 < (int)uVar9) {
            pvVar13 = a->data;
            sVar3 = a->elemsize;
            sVar4 = a->cstep;
            pMVar22 = (Mat *)(CONCAT44(local_78.elemsize._4_4_,(undefined4)local_78.elemsize) *
                             sVar2);
            pMVar17 = (Mat *)0x0;
            pMVar15 = pMVar19;
            do {
              if (0 < (int)uVar10) {
                uVar28 = 0;
                pvVar16 = pvVar13;
                do {
                  if (0 < (int)uVar11) {
                    pMVar27 = (Mat *)0x0;
                    do {
                      *(float *)((long)&pMVar15->data + (long)pMVar27 * 4) =
                           ABS(*(float *)((long)pvVar16 + (long)pMVar27 * 4)) +
                           *(float *)((long)&pMVar15->data + (long)pMVar27 * 4);
                      pMVar27 = (Mat *)((long)&pMVar27->data + 1);
                    } while (pMVar14 != pMVar27);
                  }
                  uVar28 = uVar28 + 1;
                  pvVar16 = (void *)((long)pvVar16 + lVar12 * 4);
                } while (uVar28 != uVar10);
              }
              pMVar17 = (Mat *)((long)&pMVar17->data + 1);
              pvVar13 = (void *)((long)pvVar13 + sVar3 * sVar4);
              pMVar15 = (Mat *)((long)&pMVar22->data + (long)&pMVar15->data);
            } while (pMVar17 != pMVar18);
          }
          uVar10 = b->c * (int)b->cstep;
          if (0 < (int)uVar10) {
            pMVar22 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar10 << 2);
          }
          if (0 < (int)uVar9) {
            pvVar13 = b->data;
            pMVar15 = (Mat *)0x0;
            do {
              if (0 < (int)uVar11) {
                pMVar17 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar13 + (long)pMVar17 * 4) =
                       *(float *)((long)&pMVar19->data + (long)pMVar17 * 4) +
                       *(float *)((long)pvVar13 + (long)pMVar17 * 4);
                  pMVar17 = (Mat *)((long)&pMVar17->data + 1);
                } while (pMVar14 != pMVar17);
              }
              pMVar15 = (Mat *)((long)&pMVar15->data + 1);
              pMVar19 = (Mat *)((long)&pMVar19->data +
                               sVar2 * CONCAT44(local_78.elemsize._4_4_,
                                                (undefined4)local_78.elemsize));
            } while (pMVar15 != pMVar18);
          }
          goto LAB_002016de;
        }
      }
LAB_002016e6:
      Mat::~Mat(&local_78);
    }
  }
  else {
    if (iVar1 != 2) {
      if (iVar1 != 1) goto LAB_00201703;
      iVar1 = a->w;
      pMVar22 = (Mat *)0x1;
      Mat::create(b,1,sVar2,*(Allocator **)(lVar12 + 8));
      if ((long)iVar1 < 1) {
LAB_0020081d:
        fVar29 = 0.0;
      }
      else {
        fVar29 = 0.0;
        lVar12 = 0;
        do {
          fVar29 = fVar29 + ABS(*(float *)((long)a->data + lVar12 * 4));
          lVar12 = lVar12 + 1;
        } while (iVar1 != lVar12);
      }
LAB_00200826:
      *(float *)b->data = fVar29;
      goto LAB_00201703;
    }
    uVar11 = a->w;
    pMVar14 = (Mat *)(ulong)uVar11;
    uVar10 = a->h;
    pMVar18 = (Mat *)(ulong)uVar10;
    uVar24 = CONCAT71(in_register_00000011,reduce_w) & 0xffffffff;
    bVar20 = (byte)uVar24 ^ 1;
    if (bVar20 != 0 || !reduce_h) {
      bVar20 = bVar20 | reduce_h;
      if (bVar20 == 0) {
        pMVar22 = (Mat *)0x1;
        Mat::create(b,1,uVar10,sVar2,*(Allocator **)(lVar12 + 8));
        if (0 < (int)uVar10) {
          iVar1 = a->w;
          sVar2 = a->elemsize;
          pvVar13 = a->data;
          pvVar16 = b->data;
          pMVar22 = (Mat *)0x0;
          do {
            fVar29 = 0.0;
            if (0 < (int)uVar11) {
              pMVar19 = (Mat *)0x0;
              do {
                fVar29 = fVar29 + ABS(*(float *)((long)pvVar13 + (long)pMVar19 * 4));
                pMVar19 = (Mat *)((long)&pMVar19->data + 1);
              } while (pMVar14 != pMVar19);
            }
            *(float *)((long)pvVar16 + (long)pMVar22 * 4) = fVar29;
            pMVar22 = (Mat *)((long)&pMVar22->data + 1);
            pvVar13 = (void *)((long)pvVar13 + (long)iVar1 * sVar2);
          } while (pMVar22 != pMVar18);
        }
      }
      else {
        pMVar22 = (Mat *)CONCAT71((int7)(uVar24 >> 8),bVar20);
        if (reduce_h && !reduce_w) {
          pMVar22 = pMVar14;
          Mat::create(b,uVar11,1,sVar2,*(Allocator **)(lVar12 + 8));
          uVar9 = b->c * (int)b->cstep;
          if (0 < (int)uVar9) {
            pMVar22 = (Mat *)0x0;
            memset(b->data,0,(ulong)uVar9 << 2);
          }
          if (0 < (int)uVar10) {
            iVar1 = a->w;
            sVar2 = a->elemsize;
            pvVar13 = a->data;
            pvVar16 = b->data;
            pMVar22 = (Mat *)0x0;
            do {
              if (0 < (int)uVar11) {
                pMVar19 = (Mat *)0x0;
                do {
                  *(float *)((long)pvVar16 + (long)pMVar19 * 4) =
                       ABS(*(float *)((long)pvVar13 + (long)pMVar19 * 4)) +
                       *(float *)((long)pvVar16 + (long)pMVar19 * 4);
                  pMVar19 = (Mat *)((long)&pMVar19->data + 1);
                } while (pMVar14 != pMVar19);
              }
              pMVar22 = (Mat *)((long)&pMVar22->data + 1);
              pvVar13 = (void *)((long)pvVar13 + (long)iVar1 * sVar2);
            } while (pMVar22 != pMVar18);
          }
        }
      }
      goto LAB_00201703;
    }
    Mat::create(b,1,1,sVar2,*(Allocator **)(lVar12 + 8));
    local_78.cstep = 0;
    local_78.data = (Mat *)0x0;
    local_78.refcount._0_4_ = 0;
    local_78.refcount._4_4_ = 0;
    local_78.elemsize._0_4_ = 0;
    local_78.elemsize._4_4_ = 0;
    local_78.elempack = 0;
    local_78.allocator = (Allocator *)0x0;
    local_78.dims = 0;
    local_78.w = 0;
    local_78.h = 0;
    local_78.d = 0;
    local_78.c = 0;
    pMVar22 = pMVar18;
    Mat::create(&local_78,uVar10,sVar2,*(Allocator **)(lVar12 + 0x10));
    local_84 = -100;
    if (((Mat *)local_78.data != (Mat *)0x0) && ((long)local_78.c * local_78.cstep != 0)) {
      if ((int)uVar10 < 1) {
        fVar29 = 0.0;
      }
      else {
        pvVar13 = a->data;
        iVar1 = a->w;
        sVar2 = a->elemsize;
        pMVar22 = (Mat *)0x0;
        do {
          fVar29 = 0.0;
          if (0 < (int)uVar11) {
            pMVar19 = (Mat *)0x0;
            do {
              fVar29 = fVar29 + ABS(*(float *)((long)pvVar13 + (long)pMVar19 * 4));
              pMVar19 = (Mat *)((long)&pMVar19->data + 1);
            } while (pMVar14 != pMVar19);
          }
          *(float *)((long)(void **)local_78.data + (long)pMVar22 * 4) = fVar29;
          pMVar22 = (Mat *)((long)&pMVar22->data + 1);
          pvVar13 = (void *)((long)pvVar13 + (long)iVar1 * sVar2);
        } while (pMVar22 != pMVar18);
        fVar29 = 0.0;
        pMVar14 = (Mat *)0x0;
        do {
          fVar29 = fVar29 + *(float *)((long)(void **)local_78.data + (long)pMVar14 * 4);
          pMVar14 = (Mat *)((long)&pMVar14->data + 1);
        } while (pMVar18 != pMVar14);
      }
      *(float *)b->data = fVar29;
      local_84 = 0;
    }
    piVar7 = (int *)CONCAT44(local_78.refcount._4_4_,local_78.refcount._0_4_);
    if (piVar7 != (int *)0x0) {
      LOCK();
      *piVar7 = *piVar7 + -1;
      UNLOCK();
      if (*piVar7 == 0) {
        if (local_78.allocator == (Allocator *)0x0) goto LAB_00201217;
        pMVar22 = (Mat *)local_78.data;
        (*(local_78.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  if (local_84 != 0) {
    return -100;
  }
LAB_00201703:
  if (1.1920929e-07 < ABS(v0 + -1.0)) {
    reduction_post_process<ncnn::post_process_identity<float>>(b,v0,(Option *)pMVar22);
  }
  return 0;
}

Assistant:

static int reduction(const Mat& a, Mat& b, float v0, bool reduce_w, bool reduce_h, bool reduce_c, bool post_process, float coeff, int keepdims, const Option& opt)
{
    int ret;
    if (keepdims)
        ret = reduction_op_keepdims<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    else
        ret = reduction_op<Op, Op2>(a, b, v0, reduce_w, reduce_h, reduce_c, opt);
    if (ret != 0)
        return -100;

    if (post_process || fabs(coeff - 1.f) > FLT_EPSILON)
    {
        ret = reduction_post_process<Op3>(b, coeff, opt);
        if (ret != 0)
            return -100;
    }
    return ret;
}